

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O0

bool __thiscall
QSqlQueryModel::setHeaderData
          (QSqlQueryModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  bool bVar1;
  int iVar2;
  QSqlQueryModelPrivate *pQVar3;
  qsizetype qVar4;
  QVariant *this_00;
  QVariant *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QSqlQueryModelPrivate *d;
  qsizetype in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  qsizetype in_stack_ffffffffffffff88;
  QList<QHash<int,_QVariant>_> *in_stack_ffffffffffffff90;
  bool local_31;
  int local_30;
  int local_2c;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSqlQueryModel *)0x150ba2);
  bVar1 = true;
  if ((in_EDX == 1) && (bVar1 = true, -1 < in_ESI)) {
    QModelIndex::QModelIndex((QModelIndex *)0x150bcb);
    iVar2 = (**(code **)(*in_RDI + 0x80))(in_RDI,local_28);
    bVar1 = iVar2 <= in_ESI;
  }
  if (bVar1) {
    local_31 = false;
  }
  else {
    qVar4 = QList<QHash<int,_QVariant>_>::size(&pQVar3->headers);
    if (qVar4 <= in_ESI) {
      in_stack_ffffffffffffff90 = &pQVar3->headers;
      local_2c = in_ESI + 1;
      local_30 = 0x10;
      qMax<int>(&local_2c,&local_30);
      QList<QHash<int,_QVariant>_>::resize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    QList<QHash<int,_QVariant>_>::operator[]
              ((QList<QHash<int,_QVariant>_> *)
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    this_00 = QHash<int,_QVariant>::operator[]
                        ((QHash<int,_QVariant> *)in_stack_ffffffffffffff90,(int *)in_RCX);
    QVariant::operator=(this_00,in_RCX);
    QAbstractItemModel::headerDataChanged((Orientation)in_RDI,in_EDX,in_ESI);
    local_31 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQueryModel::setHeaderData(int section, Qt::Orientation orientation,
                                   const QVariant &value, int role)
{
    Q_D(QSqlQueryModel);
    if (orientation != Qt::Horizontal || section < 0 || columnCount() <= section)
        return false;

    if (d->headers.size() <= section)
        d->headers.resize(qMax(section + 1, 16));
    d->headers[section][role] = value;
    emit headerDataChanged(orientation, section, section);
    return true;
}